

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiTests.cpp
# Opt level: O0

void vkt::wsi::anon_unknown_1::createWsiTests(TestCaseGroup *apiTests)

{
  TestCaseGroup *parent;
  char *__s;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Type local_18;
  Type local_14;
  Type wsiType;
  int typeNdx;
  TestCaseGroup *apiTests_local;
  
  _wsiType = apiTests;
  for (local_14 = TYPE_XLIB; parent = _wsiType, (int)local_14 < 6; local_14 = local_14 + TYPE_XCB) {
    local_18 = local_14;
    __s = ::vk::wsi::getName(local_14);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    addTestGroup<vk::wsi::Type>(parent,&local_38,&local_70,createTypeSpecificTests,local_18);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

void createWsiTests (tcu::TestCaseGroup* apiTests)
{
	for (int typeNdx = 0; typeNdx < vk::wsi::TYPE_LAST; ++typeNdx)
	{
		const vk::wsi::Type	wsiType	= (vk::wsi::Type)typeNdx;

		addTestGroup(apiTests, getName(wsiType), "", createTypeSpecificTests, wsiType);
	}
}